

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

void JSON::writeDictionaryKey(Pipeline *p,bool *first,string *key,size_t depth)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  writeNext(p,first,depth);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\"","");
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)local_40,(ulong)(key->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
    local_80 = (long *)*plVar1;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_80);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Pipeline::operator<<(p,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void
JSON::writeDictionaryKey(Pipeline* p, bool& first, std::string const& key, size_t depth)
{
    writeNext(p, first, depth);
    *p << std::string("\"") + key + "\": ";
}